

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

FStat * FStat::FindStat(char *name)

{
  FStat **ppFVar1;
  int iVar2;
  FStat *pFVar3;
  
  pFVar3 = FirstStat;
  if (FirstStat != (FStat *)0x0) {
    do {
      iVar2 = strcasecmp(name,pFVar3->m_Name);
      if (iVar2 == 0) {
        return pFVar3;
      }
      ppFVar1 = &pFVar3->m_Next;
      pFVar3 = *ppFVar1;
    } while (*ppFVar1 != (FStat *)0x0);
  }
  return (FStat *)0x0;
}

Assistant:

FStat *FStat::FindStat (const char *name)
{
	FStat *stat = FirstStat;

	while (stat && stricmp (name, stat->m_Name))
		stat = stat->m_Next;

	return stat;
}